

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O0

int __thiscall CNet::GetNumWire(CNet *this,int iMode,int iValue)

{
  CWire *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  reference ppCVar5;
  CLayer *this_01;
  CWire *pWire_2;
  iterator end_2;
  iterator itr_2;
  CWire *pWire_1;
  iterator end_1;
  iterator itr_1;
  CWire *pWire;
  iterator end;
  iterator itr;
  int iNum;
  int iValue_local;
  int iMode_local;
  CNet *this_local;
  
  itr._M_current._4_4_ = 0;
  if (iMode == 0) {
    if (iValue == 0x30f) {
      sVar4 = std::vector<CWire_*,_std::allocator<CWire_*>_>::size(&this->m_Wire);
      return (int)sVar4;
    }
    end = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
    pWire = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                    *)&pWire), bVar1) {
      ppCVar5 = __gnu_cxx::
                __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                operator*(&end);
      uVar2 = CObject::GetProp(&(*ppCVar5)->super_CObject);
      if ((uVar2 & iValue) != 0) {
        itr._M_current._4_4_ = itr._M_current._4_4_ + 1;
      }
      __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
      operator++(&end);
    }
  }
  else if (iMode == 1) {
    if (iValue == 3) {
      sVar4 = std::vector<CWire_*,_std::allocator<CWire_*>_>::size(&this->m_Wire);
      return (int)sVar4;
    }
    end_1 = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
    pWire_1 = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end_1,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                      *)&pWire_1), bVar1) {
      ppCVar5 = __gnu_cxx::
                __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                operator*(&end_1);
      uVar2 = CObject::GetState(&(*ppCVar5)->super_CObject);
      if ((uVar2 & iValue) != 0) {
        itr._M_current._4_4_ = itr._M_current._4_4_ + 1;
      }
      __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
      operator++(&end_1);
    }
  }
  else {
    if (iMode != 0x100000) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                    ,0x228,"int CNet::GetNumWire(int, int)");
    }
    end_2 = std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
    pWire_2 = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end_2,(__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>
                                      *)&pWire_2), bVar1) {
      ppCVar5 = __gnu_cxx::
                __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                operator*(&end_2);
      this_00 = *ppCVar5;
      iVar3 = CWire::IsCompleted(this_00);
      if ((iVar3 != 0) && (iVar3 = CWire::IsPoint(this_00), iVar3 == 0)) {
        this_01 = CWire::GetLayer(this_00);
        iVar3 = CLayer::Z(this_01);
        if (iVar3 == iValue) {
          itr._M_current._4_4_ = itr._M_current._4_4_ + 1;
        }
      }
      __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
      operator++(&end_2);
    }
  }
  return itr._M_current._4_4_;
}

Assistant:

int CNet::GetNumWire(int iMode, int iValue)
{
	int	iNum	=	0;
	switch(iMode) {
	case GET_MODE_PROP:
		if(iValue==PROP_WIRE_ANY)	return	m_Wire.size();
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetProp()&iValue)	++iNum;
		}
		break;
	case GET_MODE_STATE:
		if(iValue==STATE_WIRE_ANY)	return	m_Wire.size();			
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetState()&iValue)	++iNum;
		}
		break;
	case GET_MODE_LAYER:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;

			if(pWire->IsCompleted()&&
				!pWire->IsPoint()&&
				pWire->GetLayer()->Z()==iValue)	++iNum;
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	return	iNum;
}